

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall Stopwatch::printStatistics(Stopwatch *this)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  undefined1 auVar4 [16];
  ulong local_20;
  size_t i;
  double sum;
  Stopwatch *this_local;
  
  i = 0;
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->lapTimes);
    if (sVar1 <= local_20) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"lap time[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2,"]: ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->lapTimes,local_20);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
    poVar2 = std::operator<<(poVar2," seconds");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->lapTimes,local_20);
    i = (size_t)(*pvVar3 + (double)i);
    local_20 = local_20 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"mean lap time: ");
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->lapTimes);
  auVar4._8_4_ = (int)(sVar1 >> 0x20);
  auVar4._0_8_ = sVar1;
  auVar4._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(double)i /
                             ((auVar4._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)));
  poVar2 = std::operator<<(poVar2," seconds");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printStatistics() const {
		double sum = 0.0;
		for (size_t i = 0; i < this->lapTimes.size(); ++i) {
			std::cout << "lap time[" << i << "]: "
				<< this->lapTimes[i] << " seconds" << std::endl;
			sum += this->lapTimes[i];
		}
		std::cout << "mean lap time: "
			<< (sum / this->lapTimes.size()) << " seconds" << std::endl;
	}